

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataBuffer.cpp
# Opt level: O3

size_t __thiscall Jupiter::DataBuffer::shrink(DataBuffer *this)

{
  uint8_t *__src;
  uint8_t *puVar1;
  size_t __n;
  
  puVar1 = this->base;
  __src = this->head;
  __n = (long)this->end - (long)__src;
  this->bufferSize = __n;
  if (puVar1 != __src) {
    memmove(puVar1,__src,__n);
    puVar1 = this->base;
    __n = this->bufferSize;
  }
  puVar1 = (uint8_t *)realloc(puVar1,__n);
  this->base = puVar1;
  this->head = puVar1;
  this->end = puVar1 + this->bufferSize;
  return this->bufferSize;
}

Assistant:

size_t Jupiter::DataBuffer::shrink() {
	Jupiter::DataBuffer::bufferSize = Jupiter::DataBuffer::size();

	if (Jupiter::DataBuffer::base != Jupiter::DataBuffer::head)
		memmove(Jupiter::DataBuffer::base, Jupiter::DataBuffer::head, Jupiter::DataBuffer::bufferSize);

	Jupiter::DataBuffer::base = reinterpret_cast<uint8_t *>(realloc(Jupiter::DataBuffer::base, Jupiter::DataBuffer::bufferSize));
	Jupiter::DataBuffer::head = Jupiter::DataBuffer::base;
	Jupiter::DataBuffer::end = Jupiter::DataBuffer::head + Jupiter::DataBuffer::bufferSize;
	return Jupiter::DataBuffer::bufferSize;
}